

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_message.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::cpp::MessageGenerator::GenerateSwap
          (MessageGenerator *this,Printer *printer)

{
  Options *options;
  long lVar1;
  cpp *field;
  long *plVar2;
  cpp *pcVar3;
  ulong uVar4;
  bool bVar5;
  FileOptions_OptimizeMode FVar6;
  CType CVar7;
  pointer ppFVar8;
  FieldGenerator *pFVar9;
  int iVar10;
  FieldDescriptor *pFVar11;
  FieldDescriptor *field_00;
  FieldDescriptor *field_01;
  int iVar12;
  Descriptor *pDVar13;
  ulong uVar14;
  string first_field_name;
  Formatter format;
  string last_field_name;
  RunMap runs;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  vars;
  _Any_data local_138;
  undefined1 local_128 [16];
  undefined1 local_118 [32];
  _Alloc_hider local_f8;
  Formatter local_f0;
  undefined1 local_b8 [16];
  undefined1 local_a8 [16];
  _Hashtable<const_google::protobuf::FieldDescriptor_*,_std::pair<const_google::protobuf::FieldDescriptor_*const,_unsigned_long>,_std::allocator<std::pair<const_google::protobuf::FieldDescriptor_*const,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<const_google::protobuf::FieldDescriptor_*>,_std::hash<const_google::protobuf::FieldDescriptor_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_98;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_60;
  
  pDVar13 = this->descriptor_;
  options = &this->options_;
  local_f8._M_p = &printer->variable_delimiter_;
  FVar6 = GetOptimizeFor(*(FileDescriptor **)(pDVar13 + 0x10),options,(bool *)0x0);
  if (((FVar6 == FileOptions_OptimizeMode_LITE_RUNTIME) || (*(int *)(pDVar13 + 0x78) != 0)) ||
     (*(int *)(pDVar13 + 4) != 0)) {
    local_f0.printer_ = (Printer *)local_f8._M_p;
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::_Rb_tree(&local_f0.vars_._M_t,&(this->variables_)._M_t);
    Formatter::operator()<>(&local_f0,"void $classname$::InternalSwap($classname$* other) {\n");
    io::Printer::Indent(local_f0.printer_);
    Formatter::operator()<>(&local_f0,"using std::swap;\n");
    FVar6 = GetOptimizeFor(*(FileDescriptor **)(this->descriptor_ + 0x10),options,(bool *)0x0);
    if (FVar6 == FileOptions_OptimizeMode_CODE_SIZE) {
      Formatter::operator()<>(&local_f0,"GetReflection()->Swap(this, other);");
    }
    else {
      pDVar13 = this->descriptor_;
      if (0 < *(int *)(pDVar13 + 0x78)) {
        Formatter::operator()<>(&local_f0,"_extensions_.InternalSwap(&other->_extensions_);\n");
        pDVar13 = this->descriptor_;
      }
      local_60._M_impl.super__Rb_tree_header._M_header._M_left =
           &local_60._M_impl.super__Rb_tree_header._M_header;
      local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
      local_60._M_impl.super__Rb_tree_header._M_header._M_right =
           local_60._M_impl.super__Rb_tree_header._M_header._M_left;
      SetUnknownFieldsVariable
                (pDVar13,options,
                 (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)&local_60);
      Formatter::AddMap(&local_f0,
                        (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)&local_60);
      local_138._8_8_ = this->descriptor_;
      local_98._M_buckets._0_4_ = 0;
      local_138._0_4_ = *(undefined4 *)(local_138._8_8_ + 4);
      local_98._M_bucket_count = local_138._8_8_;
      bVar5 = operator==((Iterator *)&local_98,(Iterator *)&local_138);
      if (!bVar5) {
        do {
          pFVar11 = (FieldDescriptor *)
                    (*(long *)(local_98._M_bucket_count + 0x28) +
                    (long)(int)(uint)local_98._M_buckets * 0x48);
          if (*(once_flag **)(pFVar11 + 0x18) != (once_flag *)0x0) {
            local_b8._0_8_ = FieldDescriptor::TypeOnceInit;
            local_118._0_8_ = pFVar11;
            std::
            call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                      (*(once_flag **)(pFVar11 + 0x18),(_func_void_FieldDescriptor_ptr **)local_b8,
                       (FieldDescriptor **)local_118);
          }
          if ((((*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)(byte)pFVar11[2] * 4) == 9) &&
               (CVar7 = EffectiveStringCType(pFVar11,options), CVar7 == FieldOptions_CType_STRING))
              && ((bVar5 = IsStringInlined(pFVar11,options), !bVar5 &&
                  ((~(byte)pFVar11[1] & 0x60) != 0)))) &&
             (((((byte)pFVar11[1] & 0x10) == 0 || (lVar1 = *(long *)(pFVar11 + 0x28), lVar1 == 0))
              || ((*(int *)(lVar1 + 4) == 1 && ((*(byte *)(*(long *)(lVar1 + 0x20) + 1) & 2) != 0)))
              ))) {
            Formatter::operator()<>
                      (&local_f0,
                       "auto* lhs_arena = GetArenaForAllocation();\nauto* rhs_arena = other->GetArenaForAllocation();\n"
                      );
            break;
          }
          local_98._M_buckets._0_4_ = (uint)local_98._M_buckets + 1;
          bVar5 = operator==((Iterator *)&local_98,(Iterator *)&local_138);
        } while (!bVar5);
      }
      Formatter::operator()<>
                (&local_f0,"_internal_metadata_.InternalSwap(&other->_internal_metadata_);\n");
      if (((this->has_bit_indices_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start !=
           (this->has_bit_indices_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish) &&
         (local_98._M_buckets._0_4_ = 0, 0x3e < this->max_has_bit_index_ + 0x3eU)) {
        do {
          Formatter::operator()
                    (&local_f0,"swap(_has_bits_[$1$], other->_has_bits_[$1$]);\n",(int *)&local_98);
          local_98._M_buckets._0_4_ = (uint)local_98._M_buckets + 1;
          iVar12 = this->max_has_bit_index_ + 0x1f;
          iVar10 = this->max_has_bit_index_ + 0x3e;
          if (-1 < iVar12) {
            iVar10 = iVar12;
          }
        } while ((uint)local_98._M_buckets < (uint)(iVar10 >> 5));
      }
      local_138._8_8_ = 0;
      local_128._8_8_ =
           std::
           _Function_handler<bool_(const_google::protobuf::FieldDescriptor_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/compiler/cpp/cpp_message.cc:3464:36)>
           ::_M_invoke;
      local_128._0_8_ =
           std::
           _Function_handler<bool_(const_google::protobuf::FieldDescriptor_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/compiler/cpp/cpp_message.cc:3464:36)>
           ::_M_manager;
      local_138._M_unused._M_object = this;
      anon_unknown_0::FindRuns
                ((RunMap *)&local_98,
                 (anon_unknown_0 *)
                 (this->optimized_order_).
                 super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                 ._M_impl.super__Vector_impl_data._M_start,
                 (vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                  *)(this->optimized_order_).
                    super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish,
                 (function<bool_(const_google::protobuf::FieldDescriptor_*)> *)&local_138);
      if ((Descriptor *)local_128._0_8_ != (Descriptor *)0x0) {
        (*(code *)local_128._0_8_)(&local_138,&local_138,3);
      }
      ppFVar8 = (this->optimized_order_).
                super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if ((this->optimized_order_).
          super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
          ._M_impl.super__Vector_impl_data._M_finish != ppFVar8) {
        uVar14 = 0;
        iVar12 = 0;
        do {
          field = (cpp *)ppFVar8[uVar14];
          pFVar11 = (FieldDescriptor *)((ulong)field % local_98._M_bucket_count);
          plVar2 = *(long **)(CONCAT44(local_98._M_buckets._4_4_,(uint)local_98._M_buckets) +
                             (long)pFVar11 * 8);
          if (plVar2 != (long *)0x0) {
            plVar2 = (long *)*plVar2;
            pcVar3 = (cpp *)plVar2[1];
            field_00 = pFVar11;
            do {
              if (field == pcVar3) {
                uVar4 = plVar2[2];
                if (1 < uVar4) {
                  FieldName_abi_cxx11_((string *)&local_138,field,field_00);
                  FieldName_abi_cxx11_
                            ((string *)local_b8,
                             (cpp *)(this->optimized_order_).
                                    super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                                    ._M_impl.super__Vector_impl_data._M_start[uVar4 + (uVar14 - 1)],
                             field_01);
                  local_118._0_8_ = local_118 + 0x10;
                  std::__cxx11::string::_M_construct<char_const*>((string *)local_118,"first","");
                  Formatter::Set<std::__cxx11::string>
                            (&local_f0,(string *)local_118,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &local_138);
                  if ((FieldDescriptor *)local_118._0_8_ != (FieldDescriptor *)(local_118 + 0x10)) {
                    operator_delete((void *)local_118._0_8_);
                  }
                  local_118._0_8_ = local_118 + 0x10;
                  std::__cxx11::string::_M_construct<char_const*>((string *)local_118,"last","");
                  Formatter::Set<std::__cxx11::string>
                            (&local_f0,(string *)local_118,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_b8);
                  if ((FieldDescriptor *)local_118._0_8_ != (FieldDescriptor *)(local_118 + 0x10)) {
                    operator_delete((void *)local_118._0_8_);
                  }
                  Formatter::operator()<>
                            (&local_f0,
                             "::PROTOBUF_NAMESPACE_ID::internal::memswap<\n    PROTOBUF_FIELD_OFFSET($classname$, $last$_)\n    + sizeof($classname$::$last$_)\n    - PROTOBUF_FIELD_OFFSET($classname$, $first$_)>(\n        reinterpret_cast<char*>(&$first$_),\n        reinterpret_cast<char*>(&other->$first$_));\n"
                            );
                  if ((undefined1 *)local_b8._0_8_ != local_a8) {
                    operator_delete((void *)local_b8._0_8_);
                  }
                  if ((MessageGenerator *)local_138._M_unused._0_8_ != (MessageGenerator *)local_128
                     ) {
                    operator_delete(local_138._M_unused._M_object);
                  }
                  iVar12 = iVar12 + (int)uVar4 + -1;
                  goto LAB_002a9178;
                }
                break;
              }
              plVar2 = (long *)*plVar2;
              if (plVar2 == (long *)0x0) break;
              pcVar3 = (cpp *)plVar2[1];
              field_00 = (FieldDescriptor *)((ulong)pcVar3 % local_98._M_bucket_count);
            } while (field_00 == pFVar11);
          }
          pFVar9 = FieldGeneratorMap::get(&this->field_generators_,(FieldDescriptor *)field);
          (*pFVar9->_vptr_FieldGenerator[0xe])(pFVar9,local_f8._M_p);
LAB_002a9178:
          iVar12 = iVar12 + 1;
          uVar14 = (ulong)iVar12;
          ppFVar8 = (this->optimized_order_).
                    super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                    ._M_impl.super__Vector_impl_data._M_start;
        } while (uVar14 < (ulong)((long)(this->optimized_order_).
                                        super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                                        ._M_impl.super__Vector_impl_data._M_finish - (long)ppFVar8
                                 >> 3));
      }
      local_138._8_8_ = this->descriptor_;
      local_138._M_unused._M_member_pointer =
           local_138._M_unused._M_member_pointer & 0xffffffff00000000;
      local_b8._0_4_ = *(undefined4 *)(local_138._8_8_ + 0x6c);
      local_b8._8_8_ = local_138._8_8_;
      while (bVar5 = operator==((Iterator *)&local_138,(Iterator *)local_b8), !bVar5) {
        Formatter::operator()
                  (&local_f0,"swap($1$_, other->$1$_);\n",
                   *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                    (*(long *)(local_138._8_8_ + 0x30) + 8 + (long)(int)local_138._0_4_ * 0x28));
        local_138._0_4_ = local_138._0_4_ + 1;
      }
      local_138._M_unused._M_member_pointer =
           local_138._M_unused._M_member_pointer & 0xffffffff00000000;
      if (0 < *(int *)(this->descriptor_ + 0x6c)) {
        do {
          Formatter::operator()
                    (&local_f0,"swap(_oneof_case_[$1$], other->_oneof_case_[$1$]);\n",
                     (int *)local_138._M_pod_data);
          iVar12 = local_138._0_4_ + 1;
          local_138._0_4_ = iVar12;
        } while (iVar12 < *(int *)(this->descriptor_ + 0x6c));
      }
      if (this->num_weak_fields_ != 0) {
        Formatter::operator()<>
                  (&local_f0,"_weak_field_map_.UnsafeArenaSwap(&other->_weak_field_map_);\n");
      }
      std::
      _Hashtable<const_google::protobuf::FieldDescriptor_*,_std::pair<const_google::protobuf::FieldDescriptor_*const,_unsigned_long>,_std::allocator<std::pair<const_google::protobuf::FieldDescriptor_*const,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<const_google::protobuf::FieldDescriptor_*>,_std::hash<const_google::protobuf::FieldDescriptor_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::~_Hashtable(&local_98);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~_Rb_tree(&local_60);
    }
    io::Printer::Outdent(local_f0.printer_);
    Formatter::operator()<>(&local_f0,"}\n");
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree(&local_f0.vars_._M_t);
  }
  return;
}

Assistant:

void MessageGenerator::GenerateSwap(io::Printer* printer) {
  if (HasSimpleBaseClass(descriptor_, options_)) return;
  Formatter format(printer, variables_);

  format("void $classname$::InternalSwap($classname$* other) {\n");
  format.Indent();
  format("using std::swap;\n");

  if (HasGeneratedMethods(descriptor_->file(), options_)) {
    if (descriptor_->extension_range_count() > 0) {
      format("_extensions_.InternalSwap(&other->_extensions_);\n");
    }

    std::map<std::string, std::string> vars;
    SetUnknownFieldsVariable(descriptor_, options_, &vars);
    format.AddMap(vars);
    if (HasSingularString(descriptor_, options_)) {
      format(
          "auto* lhs_arena = GetArenaForAllocation();\n"
          "auto* rhs_arena = other->GetArenaForAllocation();\n");
    }
    format("_internal_metadata_.InternalSwap(&other->_internal_metadata_);\n");

    if (!has_bit_indices_.empty()) {
      for (int i = 0; i < HasBitsSize(); ++i) {
        format("swap(_has_bits_[$1$], other->_has_bits_[$1$]);\n", i);
      }
    }

    // If possible, we swap several fields at once, including padding.
    const RunMap runs =
        FindRuns(optimized_order_, [this](const FieldDescriptor* field) {
          return CanBeManipulatedAsRawBytes(field, options_, scc_analyzer_);
        });

    for (int i = 0; i < optimized_order_.size(); ++i) {
      const FieldDescriptor* field = optimized_order_[i];
      const auto it = runs.find(field);

      // We only apply the memswap technique to runs of more than one field, as
      // `swap(field_, other.field_)` is better than
      // `memswap<...>(&field_, &other.field_)` for generated code readability.
      if (it != runs.end() && it->second > 1) {
        // Use a memswap, then skip run_length fields.
        const size_t run_length = it->second;
        const std::string first_field_name = FieldName(field);
        const std::string last_field_name =
            FieldName(optimized_order_[i + run_length - 1]);

        format.Set("first", first_field_name);
        format.Set("last", last_field_name);

        format(
            "::PROTOBUF_NAMESPACE_ID::internal::memswap<\n"
            "    PROTOBUF_FIELD_OFFSET($classname$, $last$_)\n"
            "    + sizeof($classname$::$last$_)\n"
            "    - PROTOBUF_FIELD_OFFSET($classname$, $first$_)>(\n"
            "        reinterpret_cast<char*>(&$first$_),\n"
            "        reinterpret_cast<char*>(&other->$first$_));\n");

        i += run_length - 1;
        // ++i at the top of the loop.
      } else {
        field_generators_.get(field).GenerateSwappingCode(printer);
      }
    }

    for (auto oneof : OneOfRange(descriptor_)) {
      format("swap($1$_, other->$1$_);\n", oneof->name());
    }

    for (int i = 0; i < descriptor_->real_oneof_decl_count(); i++) {
      format("swap(_oneof_case_[$1$], other->_oneof_case_[$1$]);\n", i);
    }

    if (num_weak_fields_) {
      format("_weak_field_map_.UnsafeArenaSwap(&other->_weak_field_map_);\n");
    }
  } else {
    format("GetReflection()->Swap(this, other);");
  }

  format.Outdent();
  format("}\n");
}